

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoScrollbarOptionLabeled
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,char **aLabels,int NumLabels,
          IScrollbarScale *pScale)

{
  long lVar1;
  bool bVar2;
  float Current;
  int iVar3;
  int val;
  CUI *pCVar4;
  CUI *in_RCX;
  int *in_RDX;
  CUI *in_RSI;
  CUI *in_RDI;
  CUI *in_R8;
  CUIRect *in_R9;
  long in_FS_OFFSET;
  float FontSize_00;
  int in_stack_00000008;
  CUIRect *in_stack_00000010;
  float FontSize;
  int Max;
  int Value;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  int Index;
  undefined8 in_stack_fffffffffffffef0;
  float Cut;
  CUI *this_00;
  CUIRect *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  vec4 *in_stack_ffffffffffffff60;
  CUIRect *in_stack_ffffffffffffff68;
  char local_88 [32];
  
  Cut = (float)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Current = (float)clamp<int>(*in_RDX,0,in_stack_00000008 + -1);
  iVar3 = in_stack_00000008 + -1;
  str_format(local_88,0x80,"%s: %s",in_R8,*(undefined8 *)(&in_R9->x + (long)(int)Current * 2));
  FontSize_00 = *(float *)((long)&in_RCX->m_pHotItem + 4) * 0.8 * 0.8;
  pCVar4 = in_RCX;
  vector4_base<float>::vector4_base
            ((vector4_base<float> *)&stack0xffffffffffffff68,0.0,0.0,0.0,0.25);
  CUIRect::Draw(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                in_stack_ffffffffffffff58);
  CUIRect::VSplitLeft(in_stack_fffffffffffffef8,Cut,(CUIRect *)in_RCX,(CUIRect *)0x1de1e9);
  CUIRect::VSplitRight(in_stack_fffffffffffffef8,Cut,(CUIRect *)in_RCX,(CUIRect *)0x1de203);
  DoLabel(in_R8,in_R9,(char *)CONCAT44(Current,iVar3),FontSize_00,in_stack_ffffffffffffff08,
          (float)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  CUIRect::VMargin(in_stack_fffffffffffffef8,Cut,(CUIRect *)in_RCX);
  Index = (int)((ulong)in_RCX >> 0x20);
  this_00 = in_RSI;
  (*(code *)**(undefined8 **)in_stack_00000010)(in_stack_00000010,Current,0,iVar3);
  DoScrollbarH(pCVar4,in_R8,in_R9,Current);
  val = (**(code **)(*(long *)in_stack_00000010 + 8))(in_stack_00000010,0,iVar3);
  pCVar4 = (CUI *)HotItem(in_RDI);
  if ((((pCVar4 != in_RSI) && (bVar2 = CheckActiveItem(in_RDI,in_RSI), !bVar2)) &&
      (bVar2 = MouseHovered(in_RDI,in_stack_00000010), bVar2)) &&
     (bVar2 = MouseButtonClicked(this_00,Index), bVar2)) {
    val = (val + 1) % in_stack_00000008;
  }
  iVar3 = clamp<int>(val,0,iVar3);
  *in_RDX = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUI::DoScrollbarOptionLabeled(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, const char* aLabels[], int NumLabels, const IScrollbarScale *pScale)
{
	int Value = clamp(*pOption, 0, NumLabels - 1);
	const int Max = NumLabels - 1;

	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "%s: %s", pStr, aLabels[Value]);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+5.0f, 0, &Label);
	Label.VSplitRight(60.0f, &Label, &ScrollBar);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, 0, Max)), 0, Max);

	if(HotItem() != pID && !CheckActiveItem(pID) && MouseHovered(pRect) && MouseButtonClicked(0))
		Value = (Value + 1) % NumLabels;

	*pOption = clamp(Value, 0, Max);
}